

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[5]>(XmlWriter *this,string *name,char (*attribute) [5])

{
  XmlWriter *pXVar1;
  string *in_RDX;
  XmlWriter *in_RSI;
  ReusableStringStream rss;
  ReusableStringStream *in_stack_ffffffffffffff88;
  ReusableStringStream *in_stack_ffffffffffffff90;
  string local_58 [40];
  ReusableStringStream *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffe0;
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff90);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff90,(char (*) [5])in_stack_ffffffffffffff88);
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff88);
  pXVar1 = writeAttribute(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  std::__cxx11::string::~string(local_58);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffd0);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }